

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

ostream * operator<<(ostream *os,cmListFileContext *lfc)

{
  ostream *poVar1;
  
  std::operator<<(os,(string *)&lfc->FilePath);
  if (lfc->Line != 0) {
    poVar1 = std::operator<<(os,":");
    std::ostream::_M_insert<long>((long)poVar1);
    if ((lfc->Name)._M_string_length != 0) {
      poVar1 = std::operator<<(os," (");
      poVar1 = std::operator<<(poVar1,(string *)lfc);
      std::operator<<(poVar1,")");
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmListFileContext const& lfc)
{
  os << lfc.FilePath;
  if(lfc.Line)
    {
    os << ":" << lfc.Line;
    if(!lfc.Name.empty())
      {
      os << " (" << lfc.Name << ")";
      }
    }
  return os;
}